

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Flow_Data_t *pFVar2;
  int iVar3;
  undefined4 uVar4;
  void **__ptr;
  long *plVar5;
  long *plVar6;
  long lVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  bool bVar10;
  MinRegMan_t *pMVar11;
  Vec_Ptr_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  MinRegMan_t *extraout_RDX;
  MinRegMan_t *extraout_RDX_00;
  MinRegMan_t *extraout_RDX_01;
  MinRegMan_t *extraout_RDX_02;
  MinRegMan_t *extraout_RDX_03;
  MinRegMan_t *extraout_RDX_04;
  MinRegMan_t *extraout_RDX_05;
  MinRegMan_t *extraout_RDX_06;
  MinRegMan_t *pMVar18;
  MinRegMan_t *extraout_RDX_07;
  MinRegMan_t *extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong uVar19;
  ulong extraout_RDX_14;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  
  pMVar11 = pManMR;
  pManMR->nExactConstraints = 0;
  pMVar18 = (MinRegMan_t *)pMVar11->vExactNodes;
  iVar3 = pMVar18->fComputeInitState;
  while (iVar3 != 0) {
    if (iVar3 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    pMVar18->fComputeInitState = iVar3 - 1U;
    uVar16 = *(uint *)((long)(*(void ***)&pMVar18->fGuaranteeInitState)[iVar3 - 1U] + 0x10);
    if (pMVar11->vTimeEdges[uVar16].nSize != 0) {
      pVVar12 = pMVar11->vTimeEdges + uVar16;
      __ptr = pVVar12->pArray;
      pVVar12->nCap = 0;
      pVVar12->nSize = 0;
      pVVar12->pArray = (void **)0x0;
      if (__ptr != (void **)0x0) {
        free(__ptr);
      }
    }
    pMVar18 = (MinRegMan_t *)pManMR->vExactNodes;
    pMVar11 = pManMR;
    iVar3 = pMVar18->fComputeInitState;
  }
  pVVar12 = pMVar11->vNodes;
  if (pMVar11->fIsForward == 0) {
    if (pVVar12->nSize != 0) {
      __assert_fail("!Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                    ,0x105,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
    }
    pMVar11->nConservConstraints = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar3 = pNtk->vObjs->nSize;
      uVar23 = (long)iVar3 + 500;
      iVar20 = (int)uVar23;
      if ((pNtk->vTravIds).nCap < iVar20) {
        piVar13 = (int *)malloc(uVar23 * 4);
        (pNtk->vTravIds).pArray = piVar13;
        if (piVar13 == (int *)0x0) goto LAB_004dd50e;
        (pNtk->vTravIds).nCap = iVar20;
      }
      if (-500 < iVar3) {
        memset((pNtk->vTravIds).pArray,0,(uVar23 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar20;
    }
    iVar3 = pNtk->nTravIds;
    pNtk->nTravIds = iVar3 + 1;
    if (iVar3 < 0x3fffffff) {
      pVVar14 = pNtk->vPos;
      if (0 < pVVar14->nSize) {
        lVar21 = 0;
        do {
          Abc_FlowRetime_Dfs_back((Abc_Obj_t *)pVVar14->pArray[lVar21],pVVar12);
          lVar21 = lVar21 + 1;
          pVVar14 = pNtk->vPos;
        } while (lVar21 < pVVar14->nSize);
      }
      uVar23 = (ulong)(uint)pVVar12->nSize;
      while (0 < (int)uVar23) {
        if (pVVar12->nSize < (int)uVar23) goto LAB_004dd35c;
        plVar5 = (long *)pVVar12->pArray[uVar23 - 1];
        *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
        if (0 < *(int *)((long)plVar5 + 0x2c)) {
          lVar21 = 0;
          uVar19 = uVar23;
          do {
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[6] + lVar21 * 4) * 8);
            uVar16 = *(uint *)((long)plVar6 + 0x14);
            uVar15 = *(uint *)((long)plVar5 + 0x14);
            lVar22 = *plVar6;
            iVar3 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,(int)uVar19);
            if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) goto LAB_004dd33d;
            if (*(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8)) {
              uVar16 = (uint)((uVar15 & 0xf) == 7) + (uVar16 >> 0xc);
              if (*(uint *)((long)plVar5 + 0x14) >> 0xc < uVar16) {
                *(uint *)((long)plVar5 + 0x14) =
                     *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 * 0x1000;
              }
            }
            lVar21 = lVar21 + 1;
            uVar19 = extraout_RDX_09;
          } while (lVar21 < *(int *)((long)plVar5 + 0x2c));
        }
        if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 5) {
          *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) | 0x10;
        }
        uVar23 = uVar23 - 1;
        if (pManMR->maxDelay < (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc)) {
          __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x11e,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
        }
      }
      pVVar12->nSize = 0;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar3 = pNtk->vObjs->nSize;
        uVar19 = (long)iVar3 + 500;
        iVar20 = (int)uVar19;
        if ((pNtk->vTravIds).nCap < iVar20) {
          piVar13 = (int *)malloc(uVar19 * 4);
          (pNtk->vTravIds).pArray = piVar13;
          if (piVar13 == (int *)0x0) goto LAB_004dd50e;
          (pNtk->vTravIds).nCap = iVar20;
          uVar23 = extraout_RDX_10;
        }
        if (-500 < iVar3) {
          memset((pNtk->vTravIds).pArray,0,(uVar19 & 0xffffffff) << 2);
          uVar23 = extraout_RDX_11;
        }
        (pNtk->vTravIds).nSize = iVar20;
      }
      iVar3 = pNtk->nTravIds;
      pNtk->nTravIds = iVar3 + 1;
      if (iVar3 < 0x3fffffff) {
        pVVar14 = pNtk->vBoxes;
        if (0 < pVVar14->nSize) {
          lVar21 = 0;
          do {
            plVar5 = (long *)pVVar14->pArray[lVar21];
            if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
              lVar22 = *plVar5;
              lVar7 = *(long *)(*(long *)(lVar22 + 0x20) + 8);
              uVar23 = *(ulong *)(lVar7 + (long)*(int *)plVar5[6] * 8);
              pAVar8 = *(Abc_Obj_t **)(lVar7 + (long)*(int *)plVar5[4] * 8);
              uVar4 = *(undefined4 *)(lVar22 + 0xd8);
              iVar3 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,(int)uVar23);
              if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) goto LAB_004dd3d8;
              *(undefined4 *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) = uVar4;
              Abc_FlowRetime_Dfs_back(pAVar8,pVVar12);
              uVar16 = *(uint *)(uVar23 + 0x14);
              if ((uVar16 & 0x10) == 0) {
                *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
              }
              else {
                *(uint *)(uVar23 + 0x14) = uVar16 & 0xffffffef;
                uVar15 = *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 & 0xfffff000;
                uVar23 = (ulong)uVar15;
                *(uint *)((long)plVar5 + 0x14) = uVar15;
                if (pManMR->maxDelay < (int)(uVar16 >> 0xc)) {
                  __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0x12f,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                }
              }
            }
            lVar21 = lVar21 + 1;
            pVVar14 = pNtk->vBoxes;
          } while (lVar21 < pVVar14->nSize);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
            *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) | 0x20;
            if (0 < *(int *)((long)plVar5 + 0x2c)) {
              lVar22 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[6] + lVar22 * 4) * 8);
                lVar7 = *plVar6;
                iVar3 = (int)plVar6[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)uVar23);
                if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                if ((*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8)
                    ) && ((char)((*(uint *)((long)plVar6 + 0x14) & 0x20) >> 5) == '\0' &&
                          (*(uint *)((long)plVar6 + 0x14) & 0xf) != 8)) {
                  __assert_fail("pNext->fMarkB",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0x13b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                }
                lVar22 = lVar22 + 1;
                uVar23 = extraout_RDX_12;
              } while (lVar22 < *(int *)((long)plVar5 + 0x2c));
            }
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            puVar1 = (uint *)((long)pVVar12->pArray[lVar21 + -1] + 0x14);
            *puVar1 = *puVar1 & 0xffffffdf;
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
            *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
            if (0 < *(int *)((long)plVar5 + 0x2c)) {
              lVar22 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[6] + lVar22 * 4) * 8);
                uVar16 = *(uint *)((long)plVar6 + 0x14);
                uVar15 = *(uint *)((long)plVar5 + 0x14);
                lVar7 = *plVar6;
                iVar3 = (int)plVar6[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)uVar23);
                if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8))
                {
                  uVar16 = (uint)((uVar15 & 0xf) == 7) + (uVar16 >> 0xc);
                  if (*(uint *)((long)plVar5 + 0x14) >> 0xc < uVar16) {
                    *(uint *)((long)plVar5 + 0x14) =
                         *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 * 0x1000;
                  }
                }
                lVar22 = lVar22 + 1;
                uVar23 = extraout_RDX_13;
              } while (lVar22 < *(int *)((long)plVar5 + 0x2c));
            }
            uVar16 = (uint)((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) +
                     (*(uint *)((long)plVar5 + 0x14) >> 0xc);
            uVar23 = (ulong)uVar16;
            if (pManMR->maxDelay < (int)uVar16) {
              *(ushort *)(pManMR->pDataArray + *(uint *)(plVar5 + 2)) =
                   *(ushort *)(pManMR->pDataArray + *(uint *)(plVar5 + 2)) | 0x10;
            }
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        pVVar14 = pNtk->vBoxes;
        if (0 < pVVar14->nSize) {
          lVar21 = 0;
          do {
            uVar16 = *(uint *)((long)pVVar14->pArray[lVar21] + 0x14);
            if ((uVar16 & 0xf) == 8) {
              *(uint *)((long)pVVar14->pArray[lVar21] + 0x14) = uVar16 & 0xff8;
            }
            lVar21 = lVar21 + 1;
            pVVar14 = pNtk->vBoxes;
          } while (lVar21 < pVVar14->nSize);
        }
        uVar23 = (ulong)(uint)pVVar12->nSize;
        while( true ) {
          if ((int)uVar23 < 1) {
            pVVar14 = pNtk->vBoxes;
            if (0 < pVVar14->nSize) {
              lVar21 = 0;
              do {
                plVar5 = (long *)pVVar14->pArray[lVar21];
                if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
                  lVar22 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
                  lVar7 = *(long *)(lVar22 + (long)*(int *)plVar5[6] * 8);
                  uVar16 = *(uint *)(lVar7 + 0x14);
                  if ((uVar16 & 0xf) != 5) {
                    __assert_fail("Abc_ObjIsBo(pBo)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0x16b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                  }
                  if ((*(uint *)(*(long *)(lVar22 + (long)*(int *)plVar5[4] * 8) + 0x14) & 0xf) != 4
                     ) {
                    __assert_fail("Abc_ObjIsBi(pBi)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0x16d,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                  }
                  if ((uVar16 & 0x10) == 0) {
                    uVar16 = *(uint *)((long)plVar5 + 0x14) & 0xff8;
                  }
                  else {
                    *(uint *)(lVar7 + 0x14) = uVar16 & 0xffffffe5;
                    uVar16 = *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 & 0xfffff000;
                  }
                  *(uint *)((long)plVar5 + 0x14) = uVar16;
                }
                lVar21 = lVar21 + 1;
                pVVar14 = pNtk->vBoxes;
              } while (lVar21 < pVVar14->nSize);
            }
            lVar21 = (long)pVVar12->nSize;
            if ((long)pVVar12->nSize < 1) goto LAB_004dd2e4;
            while (lVar21 <= pVVar12->nSize) {
              plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
              *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
              if (0 < *(int *)((long)plVar5 + 0x2c)) {
                lVar22 = 0;
                do {
                  plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                     (long)*(int *)(plVar5[6] + lVar22 * 4) * 8);
                  uVar16 = *(uint *)((long)plVar6 + 0x14);
                  uVar15 = *(uint *)((long)plVar5 + 0x14);
                  lVar7 = *plVar6;
                  iVar3 = (int)plVar6[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)plVar5);
                  if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                  if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) ==
                      *(int *)(*plVar6 + 0xd8)) {
                    uVar16 = (uint)((uVar15 & 0xf) == 7) + (uVar16 >> 0xc);
                    if (*(uint *)((long)plVar5 + 0x14) >> 0xc < uVar16) {
                      *(uint *)((long)plVar5 + 0x14) =
                           *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 * 0x1000;
                    }
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < *(int *)((long)plVar5 + 0x2c));
              }
              pFVar2 = pManMR->pDataArray + *(uint *)(plVar5 + 2);
              if (pManMR->maxDelay < (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc)) {
                *(ushort *)pFVar2 = *(ushort *)pFVar2 | 0x80;
                pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
              }
              else {
                *(ushort *)pFVar2 = *(ushort *)pFVar2 & 0xff7f;
              }
              bVar10 = lVar21 < 2;
              lVar21 = lVar21 + -1;
              if (bVar10) goto LAB_004dd2e4;
            }
            break;
          }
          if (pVVar12->nSize < (int)uVar23) break;
          plVar5 = (long *)pVVar12->pArray[uVar23 - 1];
          *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
          if (0 < *(int *)((long)plVar5 + 0x2c)) {
            lVar21 = 0;
            uVar19 = uVar23;
            do {
              plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)(plVar5[6] + lVar21 * 4) * 8);
              uVar16 = *(uint *)((long)plVar6 + 0x14);
              uVar15 = *(uint *)((long)plVar5 + 0x14);
              lVar22 = *plVar6;
              iVar3 = (int)plVar6[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,(int)uVar19);
              if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) goto LAB_004dd33d;
              if (*(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8))
              {
                uVar16 = (uint)((uVar15 & 0xf) == 7) + (uVar16 >> 0xc);
                if (*(uint *)((long)plVar5 + 0x14) >> 0xc < uVar16) {
                  *(uint *)((long)plVar5 + 0x14) =
                       *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 * 0x1000;
                }
              }
              lVar21 = lVar21 + 1;
              uVar19 = extraout_RDX_14;
            } while (lVar21 < *(int *)((long)plVar5 + 0x2c));
          }
          if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 5) {
            *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) | 0x10;
          }
          uVar23 = uVar23 - 1;
          if (pManMR->maxDelay < (int)(*(uint *)((long)plVar5 + 0x14) >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0x166,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
          }
        }
LAB_004dd35c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
  }
  else {
    if (pVVar12->nSize != 0) {
      __assert_fail("!Vec_PtrSize( vNodes )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                    ,0x7c,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
    }
    pMVar11->nConservConstraints = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar3 = pNtk->vObjs->nSize;
      uVar23 = (long)iVar3 + 500;
      iVar20 = (int)uVar23;
      if ((pNtk->vTravIds).nCap < iVar20) {
        piVar13 = (int *)malloc(uVar23 * 4);
        (pNtk->vTravIds).pArray = piVar13;
        if (piVar13 == (int *)0x0) goto LAB_004dd50e;
        (pNtk->vTravIds).nCap = iVar20;
        pMVar18 = extraout_RDX;
      }
      if (-500 < iVar3) {
        memset((pNtk->vTravIds).pArray,0,(uVar23 & 0xffffffff) << 2);
        pMVar18 = extraout_RDX_00;
      }
      (pNtk->vTravIds).nSize = iVar20;
    }
    iVar3 = pNtk->nTravIds;
    pNtk->nTravIds = iVar3 + 1;
    if (iVar3 < 0x3fffffff) {
      pVVar14 = pNtk->vPis;
      if (0 < pVVar14->nSize) {
        lVar21 = 0;
        do {
          Abc_FlowRetime_Dfs_forw((Abc_Obj_t *)pVVar14->pArray[lVar21],pVVar12);
          lVar21 = lVar21 + 1;
          pVVar14 = pNtk->vPis;
          pMVar18 = extraout_RDX_01;
        } while (lVar21 < pVVar14->nSize);
      }
      uVar23 = (ulong)(uint)pVVar12->nSize;
      while (0 < (int)uVar23) {
        if (pVVar12->nSize < (int)uVar23) goto LAB_004dd35c;
        plVar5 = (long *)pVVar12->pArray[uVar23 - 1];
        *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
        if (0 < *(int *)((long)plVar5 + 0x1c)) {
          lVar21 = 0;
          do {
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + lVar21 * 4) * 8);
            lVar22 = *plVar6;
            iVar3 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,(int)pMVar18);
            if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) goto LAB_004dd33d;
            pMVar18 = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8)) {
              uVar16 = *(uint *)((long)plVar5 + 0x14) >> 0xc;
              pMVar18 = (MinRegMan_t *)(ulong)uVar16;
              if (uVar16 < *(uint *)((long)plVar6 + 0x14) >> 0xc) {
                *(uint *)((long)plVar5 + 0x14) =
                     *(uint *)((long)plVar5 + 0x14) & 0xfff |
                     *(uint *)((long)plVar6 + 0x14) & 0xfffff000;
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < *(int *)((long)plVar5 + 0x1c));
        }
        uVar23 = uVar23 - 1;
        uVar15 = *(uint *)((long)plVar5 + 0x14) & 0xf;
        uVar17 = (uint)(uVar15 == 7) * 0x1000 + *(uint *)((long)plVar5 + 0x14);
        pMVar18 = (MinRegMan_t *)(ulong)uVar17;
        uVar16 = uVar17 | 0x10;
        if (uVar15 != 4) {
          uVar16 = uVar17;
        }
        *(uint *)((long)plVar5 + 0x14) = uVar16;
        if (pManMR->maxDelay < (int)(uVar16 >> 0xc)) {
          __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x94,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
        }
      }
      pVVar12->nSize = 0;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar3 = pNtk->vObjs->nSize;
        uVar23 = (long)iVar3 + 500;
        iVar20 = (int)uVar23;
        if ((pNtk->vTravIds).nCap < iVar20) {
          piVar13 = (int *)malloc(uVar23 * 4);
          (pNtk->vTravIds).pArray = piVar13;
          if (piVar13 == (int *)0x0) {
LAB_004dd50e:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pNtk->vTravIds).nCap = iVar20;
          pMVar18 = extraout_RDX_03;
        }
        if (-500 < iVar3) {
          memset((pNtk->vTravIds).pArray,0,(uVar23 & 0xffffffff) << 2);
          pMVar18 = extraout_RDX_04;
        }
        (pNtk->vTravIds).nSize = iVar20;
      }
      iVar3 = pNtk->nTravIds;
      pNtk->nTravIds = iVar3 + 1;
      if (iVar3 < 0x3fffffff) {
        pVVar14 = pNtk->vBoxes;
        if (0 < pVVar14->nSize) {
          lVar21 = 0;
          do {
            plVar5 = (long *)pVVar14->pArray[lVar21];
            if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
              lVar22 = *plVar5;
              lVar7 = *(long *)(*(long *)(lVar22 + 0x20) + 8);
              pAVar8 = *(Abc_Obj_t **)(lVar7 + (long)*(int *)plVar5[6] * 8);
              pMVar18 = *(MinRegMan_t **)(lVar7 + (long)*(int *)plVar5[4] * 8);
              uVar4 = *(undefined4 *)(lVar22 + 0xd8);
              iVar3 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,*(int *)plVar5[6]);
              if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) {
LAB_004dd3d8:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(undefined4 *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) = uVar4;
              Abc_FlowRetime_Dfs_forw(pAVar8,pVVar12);
              uVar16 = pMVar18->nLatches;
              if ((uVar16 & 0x10) == 0) {
                *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
              }
              else {
                pMVar18->nLatches = uVar16 & 0xffffffef;
                uVar15 = *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 & 0xfffff000;
                pMVar18 = (MinRegMan_t *)(ulong)uVar15;
                *(uint *)((long)plVar5 + 0x14) = uVar15;
                if (pManMR->maxDelay < (int)(uVar16 >> 0xc)) {
                  __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0xa5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                }
              }
            }
            lVar21 = lVar21 + 1;
            pVVar14 = pNtk->vBoxes;
          } while (lVar21 < pVVar14->nSize);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
            *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) | 0x20;
            if (0 < *(int *)((long)plVar5 + 0x1c)) {
              lVar22 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[4] + lVar22 * 4) * 8);
                lVar7 = *plVar6;
                iVar3 = (int)plVar6[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)pMVar18);
                if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                if ((*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8)
                    ) && ((char)((*(uint *)((long)plVar6 + 0x14) & 0x20) >> 5) == '\0' &&
                          (*(uint *)((long)plVar6 + 0x14) & 0xf) != 8)) {
                  __assert_fail("pNext->fMarkB",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0xb1,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                }
                lVar22 = lVar22 + 1;
                pMVar18 = extraout_RDX_05;
              } while (lVar22 < *(int *)((long)plVar5 + 0x1c));
            }
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            puVar1 = (uint *)((long)pVVar12->pArray[lVar21 + -1] + 0x14);
            *puVar1 = *puVar1 & 0xffffffdf;
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        lVar21 = (long)pVVar12->nSize;
        if (0 < (long)pVVar12->nSize) {
          do {
            if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
            plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
            *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
            if (0 < *(int *)((long)plVar5 + 0x1c)) {
              lVar22 = 0;
              do {
                plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[4] + lVar22 * 4) * 8);
                lVar7 = *plVar6;
                iVar3 = (int)plVar6[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)pMVar18);
                if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                pMVar18 = extraout_RDX_06;
                if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8))
                {
                  uVar16 = *(uint *)((long)plVar5 + 0x14) >> 0xc;
                  pMVar18 = (MinRegMan_t *)(ulong)uVar16;
                  if (uVar16 < *(uint *)((long)plVar6 + 0x14) >> 0xc) {
                    *(uint *)((long)plVar5 + 0x14) =
                         *(uint *)((long)plVar5 + 0x14) & 0xfff |
                         *(uint *)((long)plVar6 + 0x14) & 0xfffff000;
                  }
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < *(int *)((long)plVar5 + 0x1c));
            }
            uVar16 = (uint)((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) * 0x1000 +
                     *(uint *)((long)plVar5 + 0x14);
            *(uint *)((long)plVar5 + 0x14) = uVar16;
            uVar16 = uVar16 >> 0xc;
            pMVar18 = (MinRegMan_t *)(ulong)uVar16;
            if (pManMR->maxDelay < (int)uVar16) {
              *(ushort *)(pManMR->pDataArray + *(uint *)(plVar5 + 2)) =
                   *(ushort *)(pManMR->pDataArray + *(uint *)(plVar5 + 2)) | 0x10;
            }
            bVar10 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar10);
        }
        pVVar14 = pNtk->vBoxes;
        if (0 < pVVar14->nSize) {
          lVar21 = 0;
          do {
            uVar16 = *(uint *)((long)pVVar14->pArray[lVar21] + 0x14);
            if ((uVar16 & 0xf) == 8) {
              *(uint *)((long)pVVar14->pArray[lVar21] + 0x14) = uVar16 & 0xff8;
            }
            lVar21 = lVar21 + 1;
            pVVar14 = pNtk->vBoxes;
            pMVar18 = (MinRegMan_t *)(long)pVVar14->nSize;
          } while (lVar21 < (long)pMVar18);
        }
        uVar23 = (ulong)(uint)pVVar12->nSize;
        do {
          pMVar11 = pManMR;
          if ((int)uVar23 < 1) {
            pVVar14 = pNtk->vBoxes;
            if (0 < pVVar14->nSize) {
              lVar21 = 0;
              pMVar18 = (MinRegMan_t *)0xfff;
              do {
                plVar5 = (long *)pVVar14->pArray[lVar21];
                if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
                  lVar22 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)plVar5[4] * 8);
                  uVar16 = *(uint *)(lVar22 + 0x14);
                  if ((uVar16 & 0x10) == 0) {
                    *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xff8;
                  }
                  else {
                    *(uint *)(lVar22 + 0x14) = uVar16 & 0xffffffef;
                    *(uint *)((long)plVar5 + 0x14) =
                         *(uint *)((long)plVar5 + 0x14) & 0xfff | uVar16 & 0xfffff000;
                    if (pMVar11->maxDelay < (int)(uVar16 >> 0xc)) {
                      __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                    ,0xe5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                    }
                  }
                }
                lVar21 = lVar21 + 1;
                pVVar14 = pNtk->vBoxes;
              } while (lVar21 < pVVar14->nSize);
            }
            lVar21 = (long)pVVar12->nSize;
            if (0 < (long)pVVar12->nSize) {
              do {
                if (pVVar12->nSize < lVar21) goto LAB_004dd35c;
                plVar5 = (long *)pVVar12->pArray[lVar21 + -1];
                *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
                if (0 < *(int *)((long)plVar5 + 0x1c)) {
                  lVar22 = 0;
                  do {
                    plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                       (long)*(int *)(plVar5[4] + lVar22 * 4) * 8);
                    lVar7 = *plVar6;
                    iVar3 = (int)plVar6[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar3 + 1,(int)pMVar18);
                    if (((long)iVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar3)) goto LAB_004dd33d;
                    pMVar18 = extraout_RDX_08;
                    if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar3 * 4) ==
                        *(int *)(*plVar6 + 0xd8)) {
                      uVar16 = *(uint *)((long)plVar5 + 0x14) >> 0xc;
                      pMVar18 = (MinRegMan_t *)(ulong)uVar16;
                      if (uVar16 < *(uint *)((long)plVar6 + 0x14) >> 0xc) {
                        *(uint *)((long)plVar5 + 0x14) =
                             *(uint *)((long)plVar5 + 0x14) & 0xfff |
                             *(uint *)((long)plVar6 + 0x14) & 0xfffff000;
                      }
                    }
                    lVar22 = lVar22 + 1;
                  } while (lVar22 < *(int *)((long)plVar5 + 0x1c));
                }
                uVar16 = (uint)((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7) * 0x1000 +
                         *(uint *)((long)plVar5 + 0x14);
                *(uint *)((long)plVar5 + 0x14) = uVar16;
                pMVar18 = pManMR;
                pFVar2 = pManMR->pDataArray + *(uint *)(plVar5 + 2);
                if (pManMR->maxDelay < (int)(uVar16 >> 0xc)) {
                  *(ushort *)pFVar2 = *(ushort *)pFVar2 | 0x80;
                  pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
                }
                else {
                  *(ushort *)pFVar2 = *(ushort *)pFVar2 & 0xff7f;
                }
                bVar10 = 1 < lVar21;
                lVar21 = lVar21 + -1;
              } while (bVar10);
            }
LAB_004dd2e4:
            pVVar12->nSize = 0;
            lVar21 = (long)pNtk->vObjs->nSize;
            if (0 < lVar21) {
              lVar22 = 0;
              do {
                pvVar9 = pNtk->vObjs->pArray[lVar22];
                if ((pvVar9 != (void *)0x0) &&
                   (pManMR->vTimeEdges[*(uint *)((long)pvVar9 + 0x10)].nSize != 0)) {
                  __assert_fail("!Vec_PtrSize(FTIMEEDGES(pObj))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0x73,"void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *)");
                }
                lVar22 = lVar22 + 1;
              } while (lVar21 != lVar22);
            }
            return;
          }
          if (pVVar12->nSize < (int)uVar23) goto LAB_004dd35c;
          plVar5 = (long *)pVVar12->pArray[uVar23 - 1];
          *(uint *)((long)plVar5 + 0x14) = *(uint *)((long)plVar5 + 0x14) & 0xfff;
          if (0 < *(int *)((long)plVar5 + 0x1c)) {
            lVar21 = 0;
            do {
              plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)(plVar5[4] + lVar21 * 4) * 8);
              lVar22 = *plVar6;
              iVar3 = (int)plVar6[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar3 + 1,(int)pMVar18);
              if (((long)iVar3 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar3)) {
LAB_004dd33d:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pMVar18 = extraout_RDX_07;
              if (*(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar3 * 4) == *(int *)(*plVar6 + 0xd8))
              {
                uVar16 = *(uint *)((long)plVar5 + 0x14) >> 0xc;
                pMVar18 = (MinRegMan_t *)(ulong)uVar16;
                if (uVar16 < *(uint *)((long)plVar6 + 0x14) >> 0xc) {
                  *(uint *)((long)plVar5 + 0x14) =
                       *(uint *)((long)plVar5 + 0x14) & 0xfff |
                       *(uint *)((long)plVar6 + 0x14) & 0xfffff000;
                }
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < *(int *)((long)plVar5 + 0x1c));
          }
          uVar23 = uVar23 - 1;
          uVar15 = *(uint *)((long)plVar5 + 0x14) & 0xf;
          uVar17 = (uint)(uVar15 == 7) * 0x1000 + *(uint *)((long)plVar5 + 0x14);
          pMVar18 = (MinRegMan_t *)(ulong)uVar17;
          uVar16 = uVar17 | 0x10;
          if (uVar15 != 4) {
            uVar16 = uVar17;
          }
          *(uint *)((long)plVar5 + 0x14) = uVar16;
          if (pManMR->maxDelay < (int)(uVar16 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0xdb,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
          }
        } while( true );
      }
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_FlowRetime_ConstrainConserv( Abc_Ntk_t * pNtk ) {  
  Abc_Obj_t *pObj;
  int i;
  void *pArray;

  // clear all exact constraints
  pManMR->nExactConstraints = 0;
  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainConserv_forw(pNtk);
  } else {
    Abc_FlowRetime_ConstrainConserv_back(pNtk);
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i)
    assert( !Vec_PtrSize(FTIMEEDGES(pObj)) );
}